

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int tile_worker_hook(void *arg1,void *arg2)

{
  TileDataDec *pTVar1;
  int iVar2;
  TileJobsDec *pTVar3;
  ThreadData *in_RSI;
  AV1Decoder *in_RDI;
  int tile_col;
  int tile_row;
  TileDataDec *tile_data;
  TileBufferDec *tile_buffer;
  TileJobsDec *cur_job_info;
  uint8_t allow_update_cdf;
  ThreadData *td;
  AV1_COMMON *cm;
  AV1Decoder *pbi;
  DecWorkerData *thread_data;
  byte local_61;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  ThreadData *td_00;
  TileBufferDec *tile_buffer_00;
  ThreadData *td_01;
  AV1Decoder *pbi_00;
  uint local_4;
  
  tile_buffer_00 = (TileBufferDec *)&in_RSI->cb_buffer_base;
  td_00 = *(ThreadData **)&(in_RDI->dcb).xd;
  td_01 = in_RSI;
  pbi_00 = in_RDI;
  iVar2 = _setjmp((__jmp_buf_tag *)((in_RDI->dcb).xd.plane[0].seg_iqmatrix[0] + 5));
  if (iVar2 == 0) {
    *(undefined4 *)((in_RDI->dcb).xd.plane[0].seg_iqmatrix[0] + 4) = 1;
    local_61 = 0;
    if (*(int *)((long)&tile_buffer_00[0x62e].data + 4) == 0) {
      local_61 = *(byte *)((long)&tile_buffer_00[0x1e].size + 4) ^ 0xff;
    }
    local_61 = local_61 & 1;
    set_decode_func_pointers(td_00,3);
    while (((td_00->dcb).corrupted == 0 &&
           (pTVar3 = get_dec_job_info((AV1DecTileMT *)
                                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
           , pTVar3 != (TileJobsDec *)0x0))) {
      pTVar1 = pTVar3->tile_data;
      tile_worker_hook_init
                (in_RDI,(DecWorkerData *)in_RSI,tile_buffer_00,(TileDataDec *)td_00,local_61);
      in_stack_ffffffffffffffa4 = (pTVar1->tile_info).tile_row;
      in_stack_ffffffffffffffa0 = (pTVar1->tile_info).tile_col;
      decode_tile(pbi_00,td_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    *(undefined4 *)((in_RDI->dcb).xd.plane[0].seg_iqmatrix[0] + 4) = 0;
    local_4 = (uint)(((td_00->dcb).corrupted != 0 ^ 0xffU) & 1);
  }
  else {
    *(undefined4 *)((in_RDI->dcb).xd.plane[0].seg_iqmatrix[0] + 4) = 0;
    *(undefined4 *)(*(long *)&(in_RDI->dcb).xd + 0x3ad0) = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int tile_worker_hook(void *arg1, void *arg2) {
  DecWorkerData *const thread_data = (DecWorkerData *)arg1;
  AV1Decoder *const pbi = (AV1Decoder *)arg2;
  AV1_COMMON *cm = &pbi->common;
  ThreadData *const td = thread_data->td;
  uint8_t allow_update_cdf;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(thread_data->error_info.jmp)) {
    thread_data->error_info.setjmp = 0;
    thread_data->td->dcb.corrupted = 1;
    return 0;
  }
  thread_data->error_info.setjmp = 1;

  allow_update_cdf = cm->tiles.large_scale ? 0 : 1;
  allow_update_cdf = allow_update_cdf && !cm->features.disable_cdf_update;

  set_decode_func_pointers(td, 0x3);

  assert(cm->tiles.cols > 0);
  while (!td->dcb.corrupted) {
    TileJobsDec *cur_job_info = get_dec_job_info(&pbi->tile_mt_info);

    if (cur_job_info != NULL) {
      const TileBufferDec *const tile_buffer = cur_job_info->tile_buffer;
      TileDataDec *const tile_data = cur_job_info->tile_data;
      tile_worker_hook_init(pbi, thread_data, tile_buffer, tile_data,
                            allow_update_cdf);
      // decode tile
      int tile_row = tile_data->tile_info.tile_row;
      int tile_col = tile_data->tile_info.tile_col;
      decode_tile(pbi, td, tile_row, tile_col);
    } else {
      break;
    }
  }
  thread_data->error_info.setjmp = 0;
  return !td->dcb.corrupted;
}